

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memenv.cc
# Opt level: O0

Status __thiscall
leveldb::anon_unknown_2::SequentialFileImpl::Read
          (SequentialFileImpl *this,size_t n,Slice *result,char *scratch)

{
  bool bVar1;
  size_t sVar2;
  long in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  Slice *unaff_retaddr;
  size_t in_stack_00000008;
  uint64_t in_stack_00000010;
  FileState *in_stack_00000018;
  Status *s;
  Slice *in_stack_ffffffffffffff88;
  char *scratch_00;
  
  scratch_00 = *(char **)(in_FS_OFFSET + 0x28);
  FileState::Read(in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr,scratch_00);
  bVar1 = Status::ok((Status *)in_stack_ffffffffffffff88);
  if (bVar1) {
    sVar2 = Slice::size(in_stack_ffffffffffffff88);
    *(size_t *)(in_RSI + 0x10) = sVar2 + *(long *)(in_RSI + 0x10);
  }
  if (*(char **)(in_FS_OFFSET + 0x28) == scratch_00) {
    return (Status)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

Status Read(size_t n, Slice* result, char* scratch) override {
    Status s = file_->Read(pos_, n, result, scratch);
    if (s.ok()) {
      pos_ += result->size();
    }
    return s;
  }